

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::OnDemoPlayerSnapshot(CClient *this,void *pData,int Size)

{
  CHolder *pCVar1;
  CPlaybackInfo *pCVar2;
  IGameClient *pIVar3;
  CClient *in_RDI;
  CHolder *pTemp;
  CPlaybackInfo *pInfo;
  void *in_stack_ffffffffffffffc8;
  
  pCVar2 = CDemoPlayer::Info(&in_RDI->m_DemoPlayer);
  (in_RDI->super_IClient).m_CurGameTick = (pCVar2->m_Info).m_CurrentTick;
  (in_RDI->super_IClient).m_PrevGameTick = pCVar2->m_PreviousTick;
  pCVar1 = in_RDI->m_aSnapshots[1];
  in_RDI->m_aSnapshots[1] = in_RDI->m_aSnapshots[0];
  in_RDI->m_aSnapshots[0] = pCVar1;
  mem_copy(in_RDI,in_stack_ffffffffffffffc8,0);
  mem_copy(in_RDI,in_stack_ffffffffffffffc8,0);
  pIVar3 = GameClient(in_RDI);
  (*(pIVar3->super_IInterface)._vptr_IInterface[5])();
  return;
}

Assistant:

void CClient::OnDemoPlayerSnapshot(void *pData, int Size)
{
	// update ticks, they could have changed
	const CDemoPlayer::CPlaybackInfo *pInfo = m_DemoPlayer.Info();
	CSnapshotStorage::CHolder *pTemp;
	m_CurGameTick = pInfo->m_Info.m_CurrentTick;
	m_PrevGameTick = pInfo->m_PreviousTick;

	// handle snapshots
	pTemp = m_aSnapshots[SNAP_PREV];
	m_aSnapshots[SNAP_PREV] = m_aSnapshots[SNAP_CURRENT];
	m_aSnapshots[SNAP_CURRENT] = pTemp;

	mem_copy(m_aSnapshots[SNAP_CURRENT]->m_pSnap, pData, Size);
	mem_copy(m_aSnapshots[SNAP_CURRENT]->m_pAltSnap, pData, Size);

	GameClient()->OnNewSnapshot();
}